

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O3

void * __thiscall Centaurus::Stage2Runner::acquire_bank(Stage2Runner *this)

{
  int *piVar1;
  void *pvVar2;
  TransferListener p_Var3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  sem_wait((sem_t *)(this->super_NonRecursiveReductionRunner).super_BaseRunner.m_slave_lock);
  pvVar2 = (this->super_NonRecursiveReductionRunner).super_BaseRunner.m_sub_window;
  uVar5 = (ulong)(uint)(this->super_NonRecursiveReductionRunner).super_BaseRunner.m_bank_num;
  do {
    do {
    } while ((int)uVar5 < 1);
    lVar6 = 0;
    do {
      piVar1 = (int *)((long)pvVar2 + lVar6 * 8 + 4);
      LOCK();
      iVar4 = *piVar1;
      bVar7 = iVar4 == 2;
      if (bVar7) {
        *piVar1 = 3;
        iVar4 = 2;
      }
      UNLOCK();
      if (bVar7) {
        p_Var3 = (this->super_NonRecursiveReductionRunner).m_xferlistener;
        if (p_Var3 != (TransferListener)0x0) {
          (*p_Var3)(-1,*(int *)((long)pvVar2 + lVar6 * 8),
                    (this->super_NonRecursiveReductionRunner).m_listener_context);
        }
        this->m_current_bank = (int)lVar6;
        return (void *)(lVar6 * (this->super_NonRecursiveReductionRunner).super_BaseRunner.
                                m_bank_size +
                       (long)(this->super_NonRecursiveReductionRunner).super_BaseRunner.
                             m_main_window);
      }
      if (iVar4 == 6) {
        return (void *)0x0;
      }
      uVar5 = (ulong)(this->super_NonRecursiveReductionRunner).super_BaseRunner.m_bank_num;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (long)uVar5);
  } while( true );
}

Assistant:

void *acquire_bank()
  {
    wait_on_semaphore();
    WindowBankEntry *banks = reinterpret_cast<WindowBankEntry *>(m_sub_window);
    while (true) {
      for (int i = 0; i < m_bank_num; i++) {
        WindowBankState old_state = WindowBankState::Stage1_Unlocked;
        if (banks[i].state.compare_exchange_weak(old_state, WindowBankState::Stage2_Locked)) {
          invoke_transfer_listener(-1, banks[i].number);
          m_current_bank = i;
          return (char *)m_main_window + m_bank_size * i;
        } else {
          if (old_state == WindowBankState::YouAreDone) {
            return NULL;
          }
        }
      }
    }
  }